

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void phosg::clamp_blit_dimensions
               (Image *dest,Image *source,ssize_t *x,ssize_t *y,ssize_t *w,ssize_t *h,ssize_t *sx,
               ssize_t *sy)

{
  ulong uVar1;
  ulong uVar2;
  
  if (*sx < 0) {
    *x = *x - *sx;
    *w = *w + *sx;
    *sx = 0;
  }
  if (*sy < 0) {
    *y = *y - *sy;
    *h = *h + *sy;
    *sy = 0;
  }
  if (*x < 0) {
    *sx = *sx - *x;
    *w = *w + *x;
    *x = 0;
  }
  if (*y < 0) {
    *sy = *sy - *y;
    *h = *h + *y;
    *y = 0;
  }
  uVar1 = *w;
  if (source->width < (long)(uVar1 + *sx)) {
    uVar1 = source->width - *sx;
    *w = uVar1;
  }
  uVar2 = *h;
  if (source->height < (long)(uVar2 + *sy)) {
    uVar2 = source->height - *sy;
    *h = uVar2;
    uVar1 = *w;
  }
  if (dest->width < (long)(uVar1 + *x)) {
    uVar1 = dest->width - *x;
    *w = uVar1;
    uVar2 = *h;
  }
  if (dest->height < (long)(uVar2 + *y)) {
    uVar2 = dest->height - *y;
    *h = uVar2;
    uVar1 = *w;
  }
  if ((long)(uVar2 | uVar1) < 0) {
    *w = 0;
    *h = 0;
  }
  return;
}

Assistant:

static inline void clamp_blit_dimensions(
    const Image& dest, const Image& source, ssize_t* x, ssize_t* y, ssize_t* w,
    ssize_t* h, ssize_t* sx, ssize_t* sy) {
  // If the source coordinates are negative, trim off the left/top
  if (*sx < 0) {
    *x -= *sx;
    *w += *sx;
    *sx = 0;
  }
  if (*sy < 0) {
    *y -= *sy;
    *h += *sy;
    *sy = 0;
  }
  // If the dest coordinates are negative, trim off the left/top
  if (*x < 0) {
    *sx -= *x;
    *w += *x;
    *x = 0;
  }
  if (*y < 0) {
    *sy -= *y;
    *h += *y;
    *y = 0;
  }
  // If the area extends beyond the source, trim off the right/bottom
  if (*sx + *w > static_cast<ssize_t>(source.get_width())) {
    *w = source.get_width() - *sx;
  }
  if (*sy + *h > static_cast<ssize_t>(source.get_height())) {
    *h = source.get_height() - *sy;
  }
  // If the area extends beyond the dest, trim off the right/bottom
  if (*x + *w > static_cast<ssize_t>(dest.get_width())) {
    *w = dest.get_width() - *x;
  }
  if (*y + *h > static_cast<ssize_t>(dest.get_height())) {
    *h = dest.get_height() - *y;
  }

  // If either width or height are negative, then the entire area is out of
  // bounds for either the source or dest - make the area empty
  if (*w < 0 || *h < 0) {
    *w = 0;
    *h = 0;
  }
}